

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O1

void __thiscall auto_array<short>::push_silence(auto_array<short> *this,size_t length)

{
  size_t new_capacity;
  
  new_capacity = this->length_ + length;
  if (this->capacity_ < new_capacity) {
    reserve(this,new_capacity);
  }
  if (this->data_ != (short *)0x0) {
    memset(this->data_ + this->length_,0,length * 2);
  }
  this->length_ = this->length_ + length;
  return;
}

Assistant:

void push_silence(size_t length)
  {
    if (length_ + length > capacity_) {
      reserve(length + length_);
    }
    if (data_) {
      PodZero(data_ + length_, length);
    }
    length_ += length;
  }